

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int compare_scores(void *a,void *b)

{
  float fVar1;
  float diff;
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  fVar1 = *(float *)((long)a + 4) - *(float *)((long)b + 4);
  if (0.0 <= fVar1) {
    if (fVar1 <= 0.0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int compare_scores(const void *a, const void *b) {
  const float diff =
      ((index_and_score_t *)a)->score - ((index_and_score_t *)b)->score;
  if (diff < 0)
    return -1;
  else if (diff > 0)
    return 1;
  return 0;
}